

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O2

UnicodeString *
icu_63::TimeZone::formatCustomID
          (int32_t hour,int32_t min,int32_t sec,UBool negative,UnicodeString *id)

{
  char16_t cVar1;
  char16_t ch;
  
  icu_63::UnicodeString::setTo(id,L"GMT",3);
  if ((min != 0 || hour != 0) || sec != 0) {
    icu_63::UnicodeString::operator+=(id,(ushort)(negative != '\0') * 2 + L'+');
    ch = L'0';
    cVar1 = L'0';
    if (9 < hour) {
      cVar1 = (short)((uint)hour / 10) + L'0';
    }
    icu_63::UnicodeString::operator+=(id,cVar1);
    icu_63::UnicodeString::operator+=(id,(short)(hour % 10) + L'0');
    icu_63::UnicodeString::operator+=(id,L':');
    if (9 < min) {
      ch = (short)((uint)min / 10) + L'0';
    }
    icu_63::UnicodeString::operator+=(id,ch);
    icu_63::UnicodeString::operator+=(id,(short)(min % 10) + L'0');
    if (sec != 0) {
      icu_63::UnicodeString::operator+=(id,L':');
      cVar1 = L'0';
      if (9 < sec) {
        cVar1 = (short)((uint)sec / 10) + L'0';
      }
      icu_63::UnicodeString::operator+=(id,cVar1);
      icu_63::UnicodeString::operator+=(id,(short)(sec % 10) + L'0');
    }
  }
  return id;
}

Assistant:

UnicodeString&
TimeZone::formatCustomID(int32_t hour, int32_t min, int32_t sec,
                         UBool negative, UnicodeString& id) {
    // Create time zone ID - GMT[+|-]hhmm[ss]
    id.setTo(GMT_ID, GMT_ID_LENGTH);
    if (hour | min | sec) {
        if (negative) {
            id += (UChar)MINUS;
        } else {
            id += (UChar)PLUS;
        }

        if (hour < 10) {
            id += (UChar)ZERO_DIGIT;
        } else {
            id += (UChar)(ZERO_DIGIT + hour/10);
        }
        id += (UChar)(ZERO_DIGIT + hour%10);
        id += (UChar)COLON;
        if (min < 10) {
            id += (UChar)ZERO_DIGIT;
        } else {
            id += (UChar)(ZERO_DIGIT + min/10);
        }
        id += (UChar)(ZERO_DIGIT + min%10);

        if (sec) {
            id += (UChar)COLON;
            if (sec < 10) {
                id += (UChar)ZERO_DIGIT;
            } else {
                id += (UChar)(ZERO_DIGIT + sec/10);
            }
            id += (UChar)(ZERO_DIGIT + sec%10);
        }
    }
    return id;
}